

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iwmmxt_helper.c
# Opt level: O0

uint64_t helper_iwmmxt_sraw_aarch64(CPUARMState_conflict *env,uint64_t x,uint32_t n)

{
  uint uVar1;
  ulong uVar2;
  byte bVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  uint32_t n_local;
  uint64_t x_local;
  CPUARMState_conflict *env_local;
  
  bVar3 = (byte)n;
  uVar1 = (uint)(int)(short)x >> (bVar3 & 0x1f);
  uVar2 = (ulong)(uVar1 & 0xffff);
  uVar5 = (ulong)((uint)(int)(short)(x >> 0x10) >> (bVar3 & 0x1f) & 0xffff);
  uVar6 = uVar5 << 0x10;
  uVar4 = (uint)(int)(short)(x >> 0x20) >> (bVar3 & 0x1f) & 0xffff;
  uVar7 = (ulong)uVar4 << 0x20;
  uVar8 = (ulong)((uint)(int)(short)(x >> 0x30) >> (bVar3 & 0x1f) & 0xffff);
  uVar9 = uVar8 << 0x30;
  (env->iwmmxt).cregs[3] =
       (uint)((uVar1 & 0x8000) != 0) << 7 | (uint)(uVar2 == 0) << 6 |
       (uint)((uVar6 & 0x80000000) != 0) << 0xf | (uint)(uVar5 == 0) << 0xe |
       (uint)((uVar7 & 0x800000000000) != 0) << 0x17 | (uint)(uVar4 == 0) << 0x16 |
       (uint)((uVar9 & 0x8000000000000000) != 0) << 0x1f | (uint)(uVar8 == 0) << 0x1e;
  return uVar2 | uVar6 | uVar7 | uVar9;
}

Assistant:

uint64_t HELPER(iwmmxt_sraw)(CPUARMState *env, uint64_t x, uint32_t n)
{
    x = ((uint64_t) ((EXTEND16(x >> 0) >> n) & 0xffff) << 0) |
        ((uint64_t) ((EXTEND16(x >> 16) >> n) & 0xffff) << 16) |
        ((uint64_t) ((EXTEND16(x >> 32) >> n) & 0xffff) << 32) |
        ((uint64_t) ((EXTEND16(x >> 48) >> n) & 0xffff) << 48);
    env->iwmmxt.cregs[ARM_IWMMXT_wCASF] =
        NZBIT16(x >> 0, 0) | NZBIT16(x >> 16, 1) |
        NZBIT16(x >> 32, 2) | NZBIT16(x >> 48, 3);
    return x;
}